

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_connect(udp_tracker_connection *this)

{
  listen_socket_handle *sock;
  ushort uVar1;
  tracker_manager *this_00;
  size_type sVar2;
  int iVar3;
  endpoint *ep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  shared_ptr<libtorrent::aux::request_callback> sVar4;
  span<const_char> in;
  span<const_char> p;
  difference_type dVar5;
  error_code ec;
  shared_ptr<libtorrent::aux::request_callback> cb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  span<char> view;
  array<char,_16UL> buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  array<char,_22UL> local_5e;
  string local_48;
  
  sVar4 = tracker_connection::requester((tracker_connection *)&cb);
  if (this->m_abort == true) {
    if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_vptr_request_callback[7])
                (cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"==> UDP_TRACKER_CONNECT [ skipped, m_abort ]",
                 sVar4.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
    }
  }
  else {
    view.m_ptr = buf._M_elems;
    view.m_len = 0x10;
    write_impl<unsigned_int,int,char>(0x417,&view);
    write_impl<unsigned_int,int,char>(0x27101980,&view);
    write_impl<int,libtorrent::aux::udp_tracker_connection::action_t,char>(connect,&view);
    dVar5 = 0x32e107;
    write_impl<int,unsigned_int,char>(this->m_transaction_id,&view);
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    sock = &(this->super_tracker_connection).m_req.outgoing_socket;
    this_00 = (this->super_tracker_connection).m_man;
    if ((this->m_hostname)._M_string_length == 0) {
      tracker_manager::send(this_00,(int)sock,&this->m_target,(size_t)&buf,0x10);
    }
    else {
      uVar1 = (this->m_target).impl_.data_.v4.sin_port;
      dVar5 = 2;
      p.m_len = 0x10;
      p.m_ptr = buf._M_elems;
      tracker_manager::send_hostname
                (this_00,sock,(this->m_hostname)._M_dataplus._M_p,
                 (uint)(ushort)(uVar1 << 8 | uVar1 >> 8),p,&ec,(udp_send_flags_t)0x2);
    }
    this->m_attempts = this->m_attempts + 1;
    if (ec.failed_ == true) {
      if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        iVar3 = (*(cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_request_callback[6])();
        if ((char)iVar3 != '\0') {
          (*(ec.cat_)->_vptr_error_category[4])(&local_c0,ec.cat_,(ulong)(uint)ec.val_);
          (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_request_callback[7])
                    (cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,"==> UDP_TRACKER_CONNECT [ failed: %s ]",local_c0._M_dataplus._M_p);
          ::std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      fail(this,&ec,sock_write,"",(seconds32)0x0,(seconds32)0x1e);
    }
    else {
      if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        iVar3 = (*(cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_request_callback[6])();
        if ((char)iVar3 != '\0') {
          sVar2 = (this->m_hostname)._M_string_length;
          if (sVar2 == 0) {
            print_endpoint_abi_cxx11_(&local_c0,(aux *)&this->m_target,ep);
          }
          else {
            ::std::operator+(&local_80,&this->m_hostname,":");
            uVar1 = (this->m_target).impl_.data_.v4.sin_port;
            to_string(&local_5e,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
            ::std::operator+(&local_c0,&local_80,local_5e._M_elems);
          }
          in.m_len = dVar5;
          in.m_ptr = (char *)0x14;
          to_hex_abi_cxx11_(&local_48,(aux *)&(this->super_tracker_connection).m_req.info_hash,in);
          (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_request_callback[7])
                    (cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,"==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]",local_c0._M_dataplus._M_p,
                     local_48._M_dataplus._M_p);
          ::std::__cxx11::string::~string((string *)&local_48);
          if (sVar2 == 0) {
            this_01 = &local_c0;
          }
          else {
            ::std::__cxx11::string::~string((string *)&local_c0);
            this_01 = &local_80;
          }
          ::std::__cxx11::string::~string((string *)this_01);
        }
      }
      this->m_state = connect;
      tracker_connection::sent_bytes(&this->super_tracker_connection,0x2c);
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void udp_tracker_connection::send_udp_connect()
	{
#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
#endif

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb) cb->debug_log("==> UDP_TRACKER_CONNECT [ skipped, m_abort ]");
#endif
			return;
		}

		std::size_t const connect_packet_size = 16;
		std::array<char, connect_packet_size> buf;
		span<char> view = buf;

		TORRENT_ASSERT(m_transaction_id != 0);

		aux::write_uint32(0x417, view);
		aux::write_uint32(0x27101980, view); // connection_id
		aux::write_int32(action_t::connect, view); // action (connect)
		aux::write_int32(m_transaction_id, view); // transaction_id
		TORRENT_ASSERT(view.empty());

		error_code ec;
		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), buf, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, buf, ec
				, udp_socket::tracker_connection);
		}

		++m_attempts;
		if (ec)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (cb && cb->should_log())
			{
				cb->debug_log("==> UDP_TRACKER_CONNECT [ failed: %s ]"
					, ec.message().c_str());
			}
#endif
			fail(ec, operation_t::sock_write);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_CONNECT [ to: %s ih: %s ]"
				, m_hostname.empty()
					? print_endpoint(m_target).c_str()
					: (m_hostname + ":" + to_string(m_target.port()).data()).c_str()
				, aux::to_hex(tracker_req().info_hash).c_str());
		}
#endif

		m_state = action_t::connect;
		sent_bytes(16 + 28); // assuming UDP/IP header
	}